

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_unit.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  bool is_ok;
  
  roaring::misc::tellmeall();
  bVar1 = run_threads_unit_tests();
  if (bVar1) {
    printf("code run completed.\n");
  }
  return (uint)!bVar1;
}

Assistant:

int main() {
    roaring::misc::tellmeall();
    bool is_ok = run_threads_unit_tests();
    if (is_ok) {
        printf("code run completed.\n");
    }
    return is_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}